

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteFieldAccessorDocComment
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,bool builder)

{
  FieldDescriptor *pFVar1;
  string *psVar2;
  string local_80;
  string local_60;
  string local_40;
  byte local_1d;
  FieldAccessorType local_1c;
  bool builder_local;
  FieldDescriptor *pFStack_18;
  FieldAccessorType type_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  local_1d = builder;
  local_1c = type;
  pFStack_18 = field;
  field_local = (FieldDescriptor *)printer;
  io::Printer::Print<>(printer,"/**\n");
  WriteDocCommentBody<google::protobuf::FieldDescriptor>((Printer *)field_local,pFStack_18);
  pFVar1 = field_local;
  FieldDescriptor::DebugString_abi_cxx11_(&local_80,pFStack_18);
  FirstLineOf(&local_60,&local_80);
  EscapeJavadoc(&local_40,&local_60);
  io::Printer::Print<char[4],std::__cxx11::string>
            ((Printer *)pFVar1," * <code>$def$</code>\n",(char (*) [4])0x7c6934,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  WriteDeprecatedJavadoc((Printer *)field_local,pFStack_18,local_1c);
  pFVar1 = field_local;
  switch(local_1c) {
  case HAZZER:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @return Whether the $name$ field is set.\n",
               (char (*) [5])0x77db8d,psVar2);
    break;
  case GETTER:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @return The $name$.\n",(char (*) [5])0x77db8d,psVar2);
    break;
  case SETTER:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @param value The $name$ to set.\n",(char (*) [5])0x77db8d,
               psVar2);
    break;
  case CLEARER:
    break;
  case LIST_COUNT:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @return The count of $name$.\n",(char (*) [5])0x77db8d,psVar2);
    break;
  case LIST_GETTER:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @return A list containing the $name$.\n",(char (*) [5])0x77db8d
               ,psVar2);
    break;
  case LIST_INDEXED_GETTER:
    io::Printer::Print<>
              ((Printer *)field_local," * @param index The index of the element to return.\n");
    pFVar1 = field_local;
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @return The $name$ at the given index.\n",
               (char (*) [5])0x77db8d,psVar2);
    break;
  case LIST_INDEXED_SETTER:
    io::Printer::Print<>((Printer *)field_local," * @param index The index to set the value at.\n");
    pFVar1 = field_local;
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @param value The $name$ to set.\n",(char (*) [5])0x77db8d,
               psVar2);
    break;
  case LIST_ADDER:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @param value The $name$ to add.\n",(char (*) [5])0x77db8d,
               psVar2);
    break;
  case LIST_MULTI_ADDER:
    psVar2 = FieldDescriptor::camelcase_name_abi_cxx11_(pFStack_18);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)pFVar1," * @param values The $name$ to add.\n",(char (*) [5])0x77db8d,
               psVar2);
  }
  if ((local_1d & 1) != 0) {
    io::Printer::Print<>((Printer *)field_local," * @return This builder for chaining.\n");
  }
  io::Printer::Print<>((Printer *)field_local," */\n");
  return;
}

Assistant:

void WriteFieldAccessorDocComment(io::Printer* printer,
                                  const FieldDescriptor* field,
                                  const FieldAccessorType type,
                                  const bool builder) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, field);
  printer->Print(" * <code>$def$</code>\n", "def",
                 EscapeJavadoc(FirstLineOf(field->DebugString())));
  WriteDeprecatedJavadoc(printer, field, type);
  switch (type) {
    case HAZZER:
      printer->Print(" * @return Whether the $name$ field is set.\n", "name",
                     field->camelcase_name());
      break;
    case GETTER:
      printer->Print(" * @return The $name$.\n", "name",
                     field->camelcase_name());
      break;
    case SETTER:
      printer->Print(" * @param value The $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case CLEARER:
      // Print nothing
      break;
    // Repeated
    case LIST_COUNT:
      printer->Print(" * @return The count of $name$.\n", "name",
                     field->camelcase_name());
      break;
    case LIST_GETTER:
      printer->Print(" * @return A list containing the $name$.\n", "name",
                     field->camelcase_name());
      break;
    case LIST_INDEXED_GETTER:
      printer->Print(" * @param index The index of the element to return.\n");
      printer->Print(" * @return The $name$ at the given index.\n", "name",
                     field->camelcase_name());
      break;
    case LIST_INDEXED_SETTER:
      printer->Print(" * @param index The index to set the value at.\n");
      printer->Print(" * @param value The $name$ to set.\n", "name",
                     field->camelcase_name());
      break;
    case LIST_ADDER:
      printer->Print(" * @param value The $name$ to add.\n", "name",
                     field->camelcase_name());
      break;
    case LIST_MULTI_ADDER:
      printer->Print(" * @param values The $name$ to add.\n", "name",
                     field->camelcase_name());
      break;
  }
  if (builder) {
    printer->Print(" * @return This builder for chaining.\n");
  }
  printer->Print(" */\n");
}